

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void call_init_write_memory(qpdf_data qpdf)

{
  __shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<QPDFWriter,QPDF&>((QPDF *)&local_20);
  std::__shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  QPDFWriter::setOutputMemory
            ((qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

static void
call_init_write_memory(qpdf_data qpdf)
{
    qpdf->qpdf_writer = std::make_shared<QPDFWriter>(*(qpdf->qpdf));
    qpdf->qpdf_writer->setOutputMemory();
}